

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

unsigned_long find_first_bit(unsigned_long *addr,unsigned_long size)

{
  int iVar1;
  ulong local_38;
  unsigned_long tmp;
  unsigned_long result;
  unsigned_long size_local;
  unsigned_long *addr_local;
  
  tmp = 0;
  size_local = (unsigned_long)addr;
  while( true ) {
    if (size <= tmp) {
      return size;
    }
    if (*(uint64_t *)size_local != 0) break;
    tmp = tmp + 0x40;
    size_local = size_local + 8;
  }
  iVar1 = ctz64(*(uint64_t *)size_local);
  local_38 = size;
  if ((long)iVar1 + tmp < size) {
    local_38 = (long)iVar1 + tmp;
  }
  return local_38;
}

Assistant:

static inline unsigned long find_first_bit(const unsigned long *addr,
                                           unsigned long size)
{
    unsigned long result, tmp;

    for (result = 0; result < size; result += BITS_PER_LONG) {
        tmp = *addr++;
        if (tmp) {
            result += ctzl(tmp);
            return result < size ? result : size;
        }
    }
    /* Not found */
    return size;
}